

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void __thiscall QPDF::readHPageOffset(QPDF *this,BitStream h)

{
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *this_00;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  int iVar2;
  offset_in_HPageOffsetEntry_to_vector<int,_std::allocator<int>_> in_R9;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  iVar2 = BitStream::getBitsInt(&h,0x20);
  ((_Var1._M_head_impl)->page_offset_hints).min_nobjects = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x20);
  *(long *)((long)&(_Var1._M_head_impl)->page_offset_hints + 8) = (long)iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x10) = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x14) = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x18) = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x1c) = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x20) = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x24) = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x28) = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x2c) = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x30) = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x34) = iVar2;
  iVar2 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x38) = iVar2;
  this_00 = (vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
            ((long)&(_Var1._M_head_impl)->page_offset_hints + 0x40);
  std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::_M_erase_at_end
            (this_00,*(pointer *)
                      &((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
                       ((long)&(_Var1._M_head_impl)->page_offset_hints + 0x40))->
                       super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
            );
  iVar2 = *(int *)((long)&((this->m)._M_t.
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linp + 0x18
                  );
  load_vector_int<QPDF::HPageOffsetEntry,int>
            (&h,iVar2,this_00,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x10),0);
  load_vector_int<QPDF::HPageOffsetEntry,long_long>
            (&h,iVar2,this_00,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x18),8);
  load_vector_int<QPDF::HPageOffsetEntry,int>
            (&h,iVar2,this_00,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x2c),0x10);
  load_vector_vector<QPDF::HPageOffsetEntry>
            (&h,iVar2,this_00,
             (ulong)(uint)*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x30),0x18,in_R9
            );
  load_vector_vector<QPDF::HPageOffsetEntry>
            (&h,iVar2,this_00,
             (ulong)(uint)*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x34),0x30,in_R9
            );
  load_vector_int<QPDF::HPageOffsetEntry,long_long>
            (&h,iVar2,this_00,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x20),0x48);
  load_vector_int<QPDF::HPageOffsetEntry,long_long>
            (&h,iVar2,this_00,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x28),0x50);
  return;
}

Assistant:

void
QPDF::readHPageOffset(BitStream h)
{
    // All comments referring to the PDF spec refer to the spec for version 1.4.

    HPageOffset& t = m->page_offset_hints;

    t.min_nobjects = h.getBitsInt(32);               // 1
    t.first_page_offset = h.getBitsInt(32);          // 2
    t.nbits_delta_nobjects = h.getBitsInt(16);       // 3
    t.min_page_length = h.getBitsInt(32);            // 4
    t.nbits_delta_page_length = h.getBitsInt(16);    // 5
    t.min_content_offset = h.getBitsInt(32);         // 6
    t.nbits_delta_content_offset = h.getBitsInt(16); // 7
    t.min_content_length = h.getBitsInt(32);         // 8
    t.nbits_delta_content_length = h.getBitsInt(16); // 9
    t.nbits_nshared_objects = h.getBitsInt(16);      // 10
    t.nbits_shared_identifier = h.getBitsInt(16);    // 11
    t.nbits_shared_numerator = h.getBitsInt(16);     // 12
    t.shared_denominator = h.getBitsInt(16);         // 13

    std::vector<HPageOffsetEntry>& entries = t.entries;
    entries.clear();
    int nitems = m->linp.npages;
    load_vector_int(h, nitems, entries, t.nbits_delta_nobjects, &HPageOffsetEntry::delta_nobjects);
    load_vector_int(
        h, nitems, entries, t.nbits_delta_page_length, &HPageOffsetEntry::delta_page_length);
    load_vector_int(
        h, nitems, entries, t.nbits_nshared_objects, &HPageOffsetEntry::nshared_objects);
    load_vector_vector(
        h,
        nitems,
        entries,
        &HPageOffsetEntry::nshared_objects,
        t.nbits_shared_identifier,
        &HPageOffsetEntry::shared_identifiers);
    load_vector_vector(
        h,
        nitems,
        entries,
        &HPageOffsetEntry::nshared_objects,
        t.nbits_shared_numerator,
        &HPageOffsetEntry::shared_numerators);
    load_vector_int(
        h, nitems, entries, t.nbits_delta_content_offset, &HPageOffsetEntry::delta_content_offset);
    load_vector_int(
        h, nitems, entries, t.nbits_delta_content_length, &HPageOffsetEntry::delta_content_length);
}